

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON * cJSON_CreateIntArray(int *numbers,int count)

{
  int iVar1;
  cJSON *c;
  cJSON *pcVar2;
  ulong uVar3;
  cJSON *pcVar4;
  bool bVar5;
  
  c = (cJSON *)(*cJSON_malloc)(0x40);
  if (c != (cJSON *)0x0) {
    c->child = (cJSON *)0x0;
    *(undefined8 *)&c->type = 0;
    c->valuedouble = 0.0;
    c->string = (char *)0x0;
    c->valuestring = (char *)0x0;
    *(undefined8 *)&c->valueint = 0;
    c->next = (cJSON *)0x0;
    c->prev = (cJSON *)0x0;
    c->type = 0x20;
  }
  if (0 < count && c != (cJSON *)0x0) {
    uVar3 = 1;
    pcVar4 = (cJSON *)0x0;
    while( true ) {
      iVar1 = numbers[uVar3 - 1];
      pcVar2 = (cJSON *)(*cJSON_malloc)(0x40);
      if (pcVar2 == (cJSON *)0x0) break;
      pcVar2->child = (cJSON *)0x0;
      *(undefined8 *)&pcVar2->type = 0;
      pcVar2->valuedouble = 0.0;
      pcVar2->string = (char *)0x0;
      pcVar2->valuestring = (char *)0x0;
      *(undefined8 *)&pcVar2->valueint = 0;
      pcVar2->next = (cJSON *)0x0;
      pcVar2->prev = (cJSON *)0x0;
      pcVar2->type = 8;
      pcVar2->valuedouble = (double)iVar1;
      pcVar2->valueint = iVar1;
      if (uVar3 == 1) {
        c->child = pcVar2;
      }
      else {
        pcVar4->next = pcVar2;
        pcVar2->prev = pcVar4;
      }
      if (c == (cJSON *)0x0) {
        return (cJSON *)0x0;
      }
      bVar5 = (uint)count <= uVar3;
      uVar3 = uVar3 + 1;
      pcVar4 = pcVar2;
      if (bVar5) {
        return c;
      }
    }
    cJSON_Delete(c);
    c = (cJSON *)0x0;
  }
  return c;
}

Assistant:

cJSON *cJSON_CreateIntArray(const int *numbers,int count)		{int i;cJSON *n=0,*p=0,*a=cJSON_CreateArray();for(i=0;a && i<count;i++){n=cJSON_CreateNumber(numbers[i]);if(!n){cJSON_Delete(a);return 0;}if(!i)a->child=n;else suffix_object(p,n);p=n;}return a;}